

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# View.cpp
# Opt level: O0

void __thiscall sf::View::View(View *this)

{
  View *in_RDI;
  Rect<float> local_18;
  
  Vector2<float>::Vector2(&in_RDI->m_center);
  Vector2<float>::Vector2(&in_RDI->m_size);
  in_RDI->m_rotation = 0.0;
  Rect<float>::Rect(&in_RDI->m_viewport,0.0,0.0,1.0,1.0);
  Transform::Transform(&in_RDI->m_transform);
  Transform::Transform(&in_RDI->m_inverseTransform);
  in_RDI->m_transformUpdated = false;
  in_RDI->m_invTransformUpdated = false;
  Rect<float>::Rect(&local_18,0.0,0.0,1000.0,1000.0);
  reset(in_RDI,&local_18);
  return;
}

Assistant:

View::View() :
m_center             (),
m_size               (),
m_rotation           (0),
m_viewport           (0, 0, 1, 1),
m_transformUpdated   (false),
m_invTransformUpdated(false)
{
    reset(FloatRect(0, 0, 1000, 1000));
}